

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O3

void Nwk_ManCollectCircle(Vec_Ptr_t *vStart,Vec_Ptr_t *vNext,int nFanMax)

{
  size_t sVar1;
  void *pvVar2;
  long *plVar3;
  int iVar4;
  void **ppvVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  vNext->nSize = 0;
  if (0 < vStart->nSize) {
    iVar6 = 0;
    lVar7 = 0;
    do {
      pvVar2 = vStart->pArray[lVar7];
      iVar4 = *(int *)((long)pvVar2 + 0x3c);
      if (0 < iVar4) {
        lVar8 = 0;
        do {
          plVar3 = *(long **)(*(long *)((long)pvVar2 + 0x48) + lVar8 * 8);
          if (plVar3 == (long *)0x0) break;
          if (((*(uint *)(plVar3 + 4) & 7) == 3) && ((int)plVar3[5] != *(int *)(*plVar3 + 0x68))) {
            *(int *)(plVar3 + 5) = *(int *)(*plVar3 + 0x68);
            if (iVar6 == vNext->nCap) {
              if (iVar6 < 0x10) {
                if (vNext->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(0x80);
                }
                else {
                  ppvVar5 = (void **)realloc(vNext->pArray,0x80);
                }
                vNext->pArray = ppvVar5;
                vNext->nCap = 0x10;
              }
              else {
                sVar1 = (ulong)(uint)(iVar6 * 2) * 8;
                if (vNext->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(sVar1);
                }
                else {
                  ppvVar5 = (void **)realloc(vNext->pArray,sVar1);
                }
                vNext->pArray = ppvVar5;
                vNext->nCap = iVar6 * 2;
              }
            }
            else {
              ppvVar5 = vNext->pArray;
            }
            iVar4 = vNext->nSize;
            iVar6 = iVar4 + 1;
            vNext->nSize = iVar6;
            ppvVar5[iVar4] = plVar3;
            iVar4 = *(int *)((long)pvVar2 + 0x3c);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < iVar4);
      }
      iVar4 = *(int *)((long)pvVar2 + 0x40);
      if (0 < iVar4) {
        lVar8 = 0;
        do {
          plVar3 = *(long **)(*(long *)((long)pvVar2 + 0x48) +
                             (*(int *)((long)pvVar2 + 0x3c) + lVar8) * 8);
          if (plVar3 == (long *)0x0) break;
          if ((((*(uint *)(plVar3 + 4) & 7) == 3) && ((int)plVar3[5] != *(int *)(*plVar3 + 0x68)))
             && (*(int *)(plVar3 + 5) = *(int *)(*plVar3 + 0x68), (int)plVar3[8] <= nFanMax)) {
            if (iVar6 == vNext->nCap) {
              if (iVar6 < 0x10) {
                if (vNext->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(0x80);
                }
                else {
                  ppvVar5 = (void **)realloc(vNext->pArray,0x80);
                }
                vNext->pArray = ppvVar5;
                vNext->nCap = 0x10;
              }
              else {
                sVar1 = (ulong)(uint)(iVar6 * 2) * 8;
                if (vNext->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(sVar1);
                }
                else {
                  ppvVar5 = (void **)realloc(vNext->pArray,sVar1);
                }
                vNext->pArray = ppvVar5;
                vNext->nCap = iVar6 * 2;
              }
            }
            else {
              ppvVar5 = vNext->pArray;
            }
            iVar4 = vNext->nSize;
            iVar6 = iVar4 + 1;
            vNext->nSize = iVar6;
            ppvVar5[iVar4] = plVar3;
            iVar4 = *(int *)((long)pvVar2 + 0x40);
          }
          lVar8 = lVar8 + 1;
        } while ((int)lVar8 < iVar4);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vStart->nSize);
  }
  return;
}

Assistant:

void Nwk_ManCollectCircle( Vec_Ptr_t * vStart, Vec_Ptr_t * vNext, int nFanMax )
{
    Nwk_Obj_t * pObj, * pNext;
    int i, k;
    Vec_PtrClear( vNext );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vStart, pObj, i )
    {
        Nwk_ObjForEachFanin( pObj, pNext, k )
        {
            if ( !Nwk_ObjIsNode(pNext) )
                continue;
            if ( Nwk_ObjIsTravIdCurrent( pNext ) )
                continue;
            Nwk_ObjSetTravIdCurrent( pNext );
            Vec_PtrPush( vNext, pNext );
        }
        Nwk_ObjForEachFanout( pObj, pNext, k )
        {
            if ( !Nwk_ObjIsNode(pNext) )
                continue;
            if ( Nwk_ObjIsTravIdCurrent( pNext ) )
                continue;
            Nwk_ObjSetTravIdCurrent( pNext );
            if ( Nwk_ObjFanoutNum(pNext) > nFanMax )
                continue;
            Vec_PtrPush( vNext, pNext );
        }
    }
}